

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintUInt32_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,uint32_t val)

{
  BaseTextGenerator local_40;
  char *local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  local_40._vptr_BaseTextGenerator = (_func_int **)&PTR__StringBaseTextGenerator_005725f0;
  local_30 = 0;
  local_28 = '\0';
  local_38 = &local_28;
  FastFieldValuePrinter::PrintUInt32((FastFieldValuePrinter *)__return_storage_ptr__,val,&local_40);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_38 == &local_28) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_20;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_38;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
  }
  __return_storage_ptr__->_M_string_length = local_30;
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintUInt32(uint32_t val) const {
  FORWARD_IMPL(PrintUInt32, val);
}